

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O1

void enet_host_channel_limit(ENetHost *host,size_t channelLimit)

{
  size_t sVar1;
  
  sVar1 = 0xff;
  if (0xffffffffffffff00 < channelLimit - 0x100) {
    sVar1 = channelLimit;
  }
  host->channelLimit = sVar1;
  return;
}

Assistant:

void
enet_host_channel_limit (ENetHost * host, size_t channelLimit)
{
    if (! channelLimit || channelLimit > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
      channelLimit = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;
    else
    if (channelLimit < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
      channelLimit = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;

    host -> channelLimit = channelLimit;
}